

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  Edition EVar1;
  ushort *puVar2;
  FeatureSet *pFVar3;
  FieldDescriptor *pFVar4;
  undefined1 *puVar5;
  OneofDescriptor *this_00;
  ReservedRange *pRVar6;
  anon_union_8_1_a8a14541_for_iterator_2 aVar7;
  DebugStringOptions *pDVar8;
  bool bVar9;
  Nonnull<char_*> pcVar10;
  Nonnull<const_char_*> pcVar11;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar12;
  int iVar13;
  SymbolVisibility *visibility;
  char *pcVar14;
  long lVar15;
  undefined4 in_register_00000034;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  size_t in_R9;
  long lVar17;
  long lVar18;
  iterator iVar19;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view src;
  string_view format_10;
  string_view format_11;
  string prefix;
  ExtensionRangeOptions range_options;
  string formatted_options;
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  MessageOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  anon_union_8_1_a8a14541_for_iterator_2 local_2a0;
  anon_union_8_1_a8a14541_for_iterator_2 local_298;
  anon_union_8_1_a8a14541_for_iterator_2 local_290 [2];
  int local_27c;
  anon_union_8_1_a8a14541_for_iterator_2 local_278;
  anon_union_8_1_a8a14541_for_iterator_2 local_270;
  anon_union_8_1_a8a14541_for_iterator_2 local_268;
  anon_union_8_1_a8a14541_for_iterator_2 local_260;
  ulong local_248;
  DebugStringOptions *local_240;
  anon_union_8_1_a8a14541_for_iterator_2 local_238;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_230;
  anon_union_8_1_a8a14541_for_iterator_2 local_228;
  anon_union_72_1_493b367e_for_MessageOptions_3 *local_220;
  ulong local_218;
  ulong local_210;
  FeatureSet *local_1d8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a8;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_1a0;
  anon_union_8_1_a8a14541_for_iterator_2 local_198;
  anon_union_8_1_a8a14541_for_iterator_2 local_190;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_170;
  MessageOptions local_150;
  undefined1 local_f8 [120];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  AlphaNum local_60;
  
  local_248 = CONCAT44(in_register_00000034,depth);
  if ((this->options_->field_0)._impl_.map_entry_ == false) {
    local_2a0.slot_ = (slot_type *)local_290;
    std::__cxx11::string::_M_construct((ulong)&local_2a0,(char)depth * '\x02');
    local_f8._24_8_ = local_f8 + 0x28;
    local_f8._32_8_ = 0;
    local_f8[0x28] = '\0';
    local_f8._56_8_ = local_f8 + 0x48;
    local_f8._64_8_ = 0;
    local_f8[0x48] = '\0';
    local_f8._88_8_ = (pointer)0x0;
    local_f8._96_8_ = (pointer)0x0;
    local_f8._104_8_ = (pointer)0x0;
    local_f8[0x70] = debug_string_options->include_comments;
    local_f8[0x71] = debug_string_options->elide_group_body;
    local_f8[0x72] = debug_string_options->elide_oneof_body;
    local_80._M_p = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_2a0.slot_,
               (Nonnull<char_*>)((long)local_298.slot_ + (long)local_2a0.slot_));
    iVar13 = (int)local_248;
    if (debug_string_options->include_comments == true) {
      local_f8[0] = GetSourceLocation(this,(SourceLocation *)(local_f8 + 8));
    }
    else {
      local_f8[0] = false;
    }
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_f8,contents);
    aVar7 = local_298;
    aVar16 = local_2a0;
    if (include_opening_clause) {
      local_278.slot_ =
           (slot_type *)(CONCAT44(local_278._4_4_,(uint)(byte)this->field_0x2) & 0xffffffff00000003)
      ;
      protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
                ((string *)&local_150,(_anonymous_namespace_ *)&local_278,visibility);
      puVar2 = (ushort *)(this->all_names_).payload_;
      local_218 = (ulong)*puVar2;
      local_238.slot_ = aVar7.slot_;
      aStack_230.slot_ = aVar16.slot_;
      local_228.slot_ =
           (slot_type *)local_150.super_Message.super_MessageLite._internal_metadata_.ptr_;
      local_220 = (anon_union_72_1_493b367e_for_MessageOptions_3 *)
                  local_150.super_Message.super_MessageLite._vptr_MessageLite;
      local_210 = (long)puVar2 + ~local_218;
      format._M_str = (char *)&local_238;
      format._M_len = (size_t)"$0$1message $2";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format,
                 (Nullable<const_absl::string_view_*>)0x3,in_R9);
      iVar13 = (int)local_248;
      if ((anon_union_72_1_493b367e_for_MessageOptions_3 *)
          local_150.super_Message.super_MessageLite._vptr_MessageLite != &local_150.field_0) {
        operator_delete(local_150.super_Message.super_MessageLite._vptr_MessageLite,
                        (ulong)((long)&((local_150.field_0._impl_._extensions_.arena_)->impl_).
                                       tag_and_id_ + 1));
      }
    }
    std::__cxx11::string::append((char *)contents);
    MessageOptions::MessageOptions(&local_150,(Arena *)0x0,this->options_);
    pFVar3 = this->proto_features_;
    if (pFVar3 != (FeatureSet *)_FeatureSet_default_instance_) {
      local_150.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
           local_150.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
      if (local_150.field_0._impl_.features_ == (FeatureSet *)0x0) {
        if ((local_150.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
          local_150.super_Message.super_MessageLite._internal_metadata_.ptr_ =
               *(undefined8 *)
                (local_150.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                0xfffffffffffffffe);
        }
        local_150.field_0._impl_.features_ =
             (FeatureSet *)
             Arena::DefaultConstruct<google::protobuf::FeatureSet>
                       ((Arena *)local_150.super_Message.super_MessageLite._internal_metadata_.ptr_)
        ;
      }
      FeatureSet::CopyFrom(local_150.field_0._impl_.features_,pFVar3);
    }
    local_27c = iVar13 + 1;
    anon_unknown_24::FormatLineOptions
              (local_27c,&local_150.super_Message,this->file_->pool_,contents);
    local_170.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_170.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_240 = debug_string_options;
    if (0 < this->field_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        if (((int)this->file_->edition_ < 1000) && ((&this->fields_->type_)[lVar17] == '\n')) {
          if (lVar15 < this->field_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->field_count_,"index < field_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            goto LAB_00212692;
          }
          local_1a8.slot_ =
               (slot_type *)
               FieldDescriptor::message_type
                         ((FieldDescriptor *)(&this->fields_->super_SymbolBase + lVar17));
          local_278.slot_ = (slot_type *)&local_170;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                      *)&local_238,&local_278,(Descriptor **)&local_1a8.slot_,
                     (Descriptor **)&local_1a8);
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar15 < this->field_count_);
    }
    if (0 < this->extension_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        if (((int)this->file_->edition_ < 1000) && ((&this->extensions_->type_)[lVar17] == '\n')) {
          if (lVar15 < this->extension_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->extension_count_,"index < extension_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa95,pcVar11);
            goto LAB_00212692;
          }
          local_1a8.slot_ =
               (slot_type *)
               FieldDescriptor::message_type
                         ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar17));
          local_278.slot_ = (slot_type *)&local_170;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                      *)&local_238,&local_278,(Descriptor **)&local_1a8.slot_,
                     (Descriptor **)&local_1a8);
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar15 < this->extension_count_);
    }
    if (0 < this->nested_type_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        local_238.slot_ = (slot_type *)(&this->nested_types_->super_SymbolBase + lVar17);
        iVar19 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                 ::find<google::protobuf::Descriptor_const*>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                             *)&local_170,
                            (key_arg<const_google::protobuf::Descriptor_*> *)&local_238.slot_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::AssertNotDebugCapacity(&local_170);
        if (iVar19.ctrl_ == (ctrl_t *)0x0) {
          if (lVar15 < this->nested_type_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->nested_type_count_,"index < nested_type_count()"
                                );
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa8a,pcVar11);
            goto LAB_00212692;
          }
          DebugString((Descriptor *)(&this->nested_types_->super_SymbolBase + lVar17),local_27c,
                      contents,local_240,true);
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0xa0;
      } while (lVar15 < this->nested_type_count_);
    }
    pDVar8 = local_240;
    if (0 < this->enum_type_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        EnumDescriptor::DebugString
                  ((EnumDescriptor *)(&this->enum_types_->super_SymbolBase + lVar17),local_27c,
                   contents,pDVar8);
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar15 < this->enum_type_count_);
    }
    if (0 < this->field_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        pFVar4 = this->fields_;
        if (((&pFVar4->field_0x3)[lVar17] & 1) == 0) {
LAB_00211c5e:
          if (lVar15 < this->field_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->field_count_,"index < field_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            goto LAB_00212692;
          }
          FieldDescriptor::DebugString
                    ((FieldDescriptor *)(&this->fields_->super_SymbolBase + lVar17),local_27c,
                     contents,local_240);
        }
        else {
          if (((&pFVar4->field_0x1)[lVar17] & 0x10) != 0) {
            lVar18 = *(long *)((long)&pFVar4->scope_ + lVar17);
            if (lVar18 != 0) goto LAB_00211c0d;
LAB_002127a1:
            iVar13 = 0xb31;
LAB_002127a6:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,iVar13);
          }
          lVar18 = 0;
LAB_00211c0d:
          if (lVar18 == 0) {
            iVar13 = 0xb63;
            goto LAB_002127a6;
          }
          if ((*(int *)(lVar18 + 4) == 1) && ((*(byte *)(*(long *)(lVar18 + 0x30) + 1) & 2) != 0)) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb64,"!res->is_synthetic()");
            goto LAB_00212692;
          }
          if (((&pFVar4->field_0x3)[lVar17] & 1) == 0) goto LAB_00211c5e;
          if (lVar15 < this->field_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->field_count_,"index < field_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            goto LAB_00212692;
          }
          if (((&this->fields_->field_0x1)[lVar17] & 0x10) == 0) {
            lVar18 = 0;
          }
          else {
            lVar18 = *(long *)((long)&this->fields_->scope_ + lVar17);
            if (lVar18 == 0) goto LAB_002127a1;
          }
          if ((long)*(int *)(lVar18 + 4) < 1) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (0,(long)*(int *)(lVar18 + 4),"index < field_count()");
          }
          else {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xab3,pcVar11);
            goto LAB_00212692;
          }
          puVar5 = *(undefined1 **)(lVar18 + 0x30);
          if (lVar15 < this->field_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->field_count_,"index < field_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            goto LAB_00212692;
          }
          if (&this->fields_->super_SymbolBase + lVar17 == (SymbolBase *)puVar5) {
            if (lVar15 < this->field_count_) {
              pcVar11 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar15,(long)this->field_count_,"index < field_count()");
            }
            if (pcVar11 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_238,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xa88,pcVar11);
              goto LAB_00212692;
            }
            this_00 = *(OneofDescriptor **)((long)&this->fields_->scope_ + lVar17);
            if (this_00 == (OneofDescriptor *)0x0) goto LAB_002127a1;
            OneofDescriptor::DebugString(this_00,local_27c,contents,local_240);
          }
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar15 < this->field_count_);
    }
    if (0 < this->extension_range_count_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        aVar7 = local_298;
        aVar16 = local_2a0;
        pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)&this->extension_ranges_->start_ + lVar17),
                             (Nonnull<char_*>)&local_228);
        local_268.slot_ = (slot_type *)(pcVar10 + -(long)&local_228);
        local_278 = aVar7;
        local_270 = aVar16;
        format_00._M_str = (char *)&local_278;
        format_00._M_len = (size_t)"$0  extensions $1";
        local_260.slot_ = (slot_type *)&local_228;
        local_238.slot_ = local_268.slot_;
        aStack_230.slot_ = (slot_type *)&local_228;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)contents,(Nonnull<std::string_*>)0x11,format_00,
                   (Nullable<const_absl::string_view_*>)0x2,in_R9);
        if (lVar15 < this->extension_range_count_) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar15,(long)this->extension_range_count_,
                               "index < extension_range_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar11);
          goto LAB_00212692;
        }
        iVar13 = *(int *)((long)&this->extension_ranges_->end_ + lVar17);
        if (lVar15 < this->extension_range_count_) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar15,(long)this->extension_range_count_,
                               "index < extension_range_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar11);
          goto LAB_00212692;
        }
        if (*(int *)((long)&this->extension_ranges_->start_ + lVar17) + 1 < iVar13) {
          if (lVar15 < this->extension_range_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar15,(long)this->extension_range_count_,
                                 "index < extension_range_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_278,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa94,pcVar11);
            goto LAB_00212790;
          }
          pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (*(int *)((long)&this->extension_ranges_->end_ + lVar17) + -1,
                               (Nonnull<char_*>)&local_228);
          local_278.slot_ = (slot_type *)(pcVar10 + -(long)&local_228);
          format_01._M_str = (char *)&local_278;
          format_01._M_len = (size_t)" to $0";
          local_270.slot_ = (slot_type *)&local_228;
          local_238.slot_ = local_278.slot_;
          aStack_230.slot_ = (slot_type *)&local_228;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,format_01
                     ,(Nullable<const_absl::string_view_*>)0x1,in_R9);
        }
        if (lVar15 < this->extension_range_count_) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar15,(long)this->extension_range_count_,
                               "index < extension_range_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_278,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar11);
LAB_00212790:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_278);
        }
        ExtensionRangeOptions::ExtensionRangeOptions
                  ((ExtensionRangeOptions *)&local_238,(Arena *)0x0,
                   *(ExtensionRangeOptions **)((long)&this->extension_ranges_->options_ + lVar17));
        if (lVar15 < this->extension_range_count_) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar15,(long)this->extension_range_count_,
                               "index < extension_range_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_278,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar11);
          goto LAB_00212790;
        }
        pFVar3 = *(FeatureSet **)((long)&this->extension_ranges_->proto_features_ + lVar17);
        if (pFVar3 != (FeatureSet *)_FeatureSet_default_instance_) {
          local_210 = local_210 | 1;
          if (local_1d8 == (FeatureSet *)0x0) {
            aVar16 = aStack_230;
            if (((ulong)aStack_230.slot_ & 1) != 0) {
              aVar16 = (anon_union_8_1_a8a14541_for_iterator_2)
                       ((anon_union_8_1_a8a14541_for_iterator_2 *)
                       ((ulong)aStack_230.slot_ & 0xfffffffffffffffe))->slot_;
            }
            local_1d8 = (FeatureSet *)
                        Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)aVar16.slot_)
            ;
          }
          FeatureSet::CopyFrom(local_1d8,pFVar3);
        }
        local_1c8._0_8_ = local_1c8 + 0x10;
        local_1c8._8_8_ = (anon_union_8_1_a8a14541_for_iterator_2 *)0x0;
        local_1b8._M_local_buf[0] = '\0';
        bVar9 = anon_unknown_24::FormatBracketedOptions
                          (local_27c,(Message *)&local_238,this->file_->pool_,(string *)local_1c8);
        if (bVar9) {
          local_278 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
          local_270 = (anon_union_8_1_a8a14541_for_iterator_2)0x4a4b77;
          local_1a8.slot_ = (slot_type *)local_1c8._8_8_;
          aStack_1a0.slot_ = (slot_type *)local_1c8._0_8_;
          local_60.piece_._M_len = 1;
          local_60.piece_._M_str = "]";
          absl::lts_20250127::StrAppend
                    (contents,(AlphaNum *)&local_278,(AlphaNum *)&local_1a8,&local_60);
        }
        local_278 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
        local_270.slot_ = (slot_type *)0x3f2e3a;
        absl::lts_20250127::StrAppend(contents,(AlphaNum *)&local_278);
        if ((anon_union_8_1_a8a14541_for_iterator_2 *)local_1c8._0_8_ !=
            (anon_union_8_1_a8a14541_for_iterator_2 *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,
                          CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0])
                          + 1);
        }
        ExtensionRangeOptions::~ExtensionRangeOptions((ExtensionRangeOptions *)&local_238);
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x28;
      } while (lVar15 < this->extension_range_count_);
    }
    pDVar8 = local_240;
    if (0 < this->extension_count_) {
      local_248 = (ulong)((int)local_248 + 2);
      lVar17 = 0;
      lVar18 = 0;
      lVar15 = 0;
      do {
        if (*(long *)((long)&this->extensions_->containing_type_ + lVar17) != lVar15) {
          if (lVar17 != 0) {
            local_238 = local_298;
            aStack_230 = local_2a0;
            format_02._M_str = (char *)&local_238;
            format_02._M_len = (size_t)"$0  }\n";
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,
                       format_02,(Nullable<const_absl::string_view_*>)0x1,in_R9);
          }
          if (lVar18 < this->extension_count_) {
            pcVar11 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar18,(long)this->extension_count_,"index < extension_count()");
          }
          if (pcVar11 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa95,pcVar11);
LAB_00212692:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_238);
          }
          lVar15 = *(long *)((long)&this->extensions_->containing_type_ + lVar17);
          local_228._2_6_ = 0;
          local_228._0_2_ = *(ushort *)(*(long *)(lVar15 + 0x10) + 2);
          local_238 = local_298;
          aStack_230 = local_2a0;
          local_220 = (anon_union_72_1_493b367e_for_MessageOptions_3 *)
                      (~(ulong)local_228.slot_ + *(long *)(lVar15 + 0x10));
          format_03._M_str = (char *)&local_238;
          format_03._M_len = (size_t)"$0  extend .$1 {\n";
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)0x11,format_03,
                     (Nullable<const_absl::string_view_*>)0x2,in_R9);
        }
        if (lVar18 < this->extension_count_) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar18,(long)this->extension_count_,"index < extension_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa95,pcVar11);
          goto LAB_00212692;
        }
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar17),(int)local_248
                   ,contents,pDVar8);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar18 < this->extension_count_);
      if (0 < this->extension_count_) {
        local_238 = local_298;
        aStack_230 = local_2a0;
        format_04._M_str = (char *)&local_238;
        format_04._M_len = (size_t)"$0  }\n";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,format_04,
                   (Nullable<const_absl::string_view_*>)0x1,in_R9);
      }
    }
    if (0 < this->reserved_range_count_) {
      local_238 = local_298;
      aStack_230 = local_2a0;
      format_05._M_str = (char *)&local_238;
      format_05._M_len = (size_t)"$0  reserved ";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_05,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      if (0 < this->reserved_range_count_) {
        lVar15 = 0;
        do {
          pRVar6 = this->reserved_ranges_;
          if (pRVar6[lVar15].end == pRVar6[lVar15].start + 1) {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (pRVar6[lVar15].start,(Nonnull<char_*>)&local_228);
            local_278.slot_ = (slot_type *)(pcVar10 + -(long)&local_228);
            format_06._M_str = (char *)&local_278;
            format_06._M_len = (size_t)"$0, ";
            local_270.slot_ = (slot_type *)&local_228;
            local_238.slot_ = local_278.slot_;
            aStack_230.slot_ = (slot_type *)&local_228;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_06,
                       (Nullable<const_absl::string_view_*>)0x1,in_R9);
          }
          else if (pRVar6[lVar15].end < 0x20000000) {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (pRVar6[lVar15].start,(Nonnull<char_*>)&local_228);
            local_238.slot_ = (slot_type *)(pcVar10 + -(long)&local_228);
            aStack_230.slot_ = (slot_type *)&local_228;
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (pRVar6[lVar15].end + -1,(Nonnull<char_*>)&local_268);
            local_278.slot_ = (slot_type *)(pcVar10 + -(long)&local_268);
            local_1a8.slot_ = local_238.slot_;
            aStack_1a0.slot_ = aStack_230.slot_;
            format_08._M_str = (char *)&local_1a8;
            format_08._M_len = (size_t)"$0 to $1, ";
            local_270.slot_ = (slot_type *)&local_268;
            local_198.slot_ = local_278.slot_;
            local_190.slot_ = (slot_type *)&local_268;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0xa,format_08,
                       (Nullable<const_absl::string_view_*>)0x2,in_R9);
          }
          else {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (pRVar6[lVar15].start,(Nonnull<char_*>)&local_228);
            local_278.slot_ = (slot_type *)(pcVar10 + -(long)&local_228);
            format_07._M_str = (char *)&local_278;
            format_07._M_len = (size_t)"$0 to max, ";
            local_270.slot_ = (slot_type *)&local_228;
            local_238.slot_ = local_278.slot_;
            aStack_230.slot_ = (slot_type *)&local_228;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0xb,format_07,
                       (Nullable<const_absl::string_view_*>)0x1,in_R9);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < this->reserved_range_count_);
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x3f2e3a);
    }
    if (0 < this->reserved_name_count_) {
      paVar12 = &local_238;
      local_238 = local_298;
      aStack_230 = local_2a0;
      format_09._M_str = (char *)paVar12;
      format_09._M_len = (size_t)"$0  reserved ";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_09,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      if (0 < this->reserved_name_count_) {
        lVar15 = 0;
        do {
          EVar1 = this->file_->edition_;
          src._M_str = (char *)paVar12;
          src._M_len = (size_t)(this->reserved_names_[lVar15]->_M_dataplus)._M_p;
          absl::lts_20250127::CEscape_abi_cxx11_
                    ((string *)&local_238,
                     (lts_20250127 *)this->reserved_names_[lVar15]->_M_string_length,src);
          pcVar14 = "$0, ";
          if ((int)EVar1 < 1000) {
            pcVar14 = "\"$0\", ";
          }
          local_278 = aStack_230;
          local_270.slot_ = local_238.slot_;
          format_10._M_str = (char *)&local_278;
          format_10._M_len = (size_t)pcVar14;
          paVar12 = &local_278;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,
                     (Nonnull<std::string_*>)((ulong)((int)EVar1 < 1000) * 2 + 4),format_10,
                     (Nullable<const_absl::string_view_*>)0x1,in_R9);
          if ((anon_union_8_1_a8a14541_for_iterator_2 *)local_238.slot_ != &local_228) {
            operator_delete(local_238.slot_,(ulong)((long)local_228.slot_ + 1));
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < this->reserved_name_count_);
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x3f2e3a);
    }
    local_238 = local_298;
    aStack_230 = local_2a0;
    format_11._M_str = (char *)&local_238;
    format_11._M_len = (size_t)"$0}\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_11,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_f8,contents);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::destructor_impl(&local_170);
    MessageOptions::~MessageOptions(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f8 + 0x58));
    if ((undefined1 *)local_f8._56_8_ != local_f8 + 0x48) {
      operator_delete((void *)local_f8._56_8_,CONCAT71(local_f8._73_7_,local_f8[0x48]) + 1);
    }
    if ((undefined1 *)local_f8._24_8_ != local_f8 + 0x28) {
      operator_delete((void *)local_f8._24_8_,CONCAT71(local_f8._41_7_,local_f8[0x28]) + 1);
    }
    if ((anon_union_8_1_a8a14541_for_iterator_2 *)local_2a0.slot_ != local_290) {
      operator_delete(local_2a0.slot_,(long)local_290[0].slot_ + 1);
    }
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    absl::SubstituteAndAppend(contents, "$0$1message $2", prefix,
                              VisibilityToKeyword(visibility_keyword()),
                              name());
  }
  contents->append(" {\n");

  MessageOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (IsGroupSyntax(file()->edition(), field(i))) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(file()->edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (!groups.contains(nested_type(i))) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    absl::SubstituteAndAppend(contents, "$0  extensions $1", prefix,
                              extension_range(i)->start_number());
    if (extension_range(i)->end_number() >
        extension_range(i)->start_number() + 1) {
      absl::SubstituteAndAppend(contents, " to $0",
                                extension_range(i)->end_number() - 1);
    }
    ExtensionRangeOptions range_options = extension_range(i)->options();
    CopyFeaturesToOptions(extension_range(i)->proto_features_, &range_options);
    std::string formatted_options;
    if (FormatBracketedOptions(depth, range_options, file()->pool(),
                               &formatted_options)) {
      absl::StrAppend(contents, " [", formatted_options, "]");
    }
    absl::StrAppend(contents, ";\n");
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) absl::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    absl::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}